

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O2

int pkcs7_wrap(scep *s,int enc_base64)

{
  char **parg;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  stack_st_X509 *certs;
  BIO *pBVar4;
  PKCS7 *p7;
  BIO_METHOD *pBVar5;
  PKCS7 *p7_00;
  PKCS7_SIGNER_INFO *p7si;
  stack_st_X509_ATTRIBUTE *attrs;
  ASN1_OBJECT *data;
  BIO *append;
  BIO *b;
  char *pcVar6;
  X509 *pXVar7;
  X509 *pXVar8;
  ulong uVar9;
  EVP_PKEY *local_58;
  uchar *buffer;
  BIO *local_40;
  X509 *local_38;
  
  buffer = (uchar *)0x0;
  s->sender_nonce_len = 0x10;
  puVar2 = generate_nonce(0x10);
  s->sender_nonce = puVar2;
  switch(s->request_type) {
  case 0x13:
    s->request_type_str = "19";
    pXVar8 = (X509 *)s->signercert;
    local_58 = (EVP_PKEY *)s->signerkey;
    if (d_flag != 0) {
      printf("%s: creating inner PKCS#7\n",pname);
    }
    pBVar5 = BIO_s_mem();
    pBVar4 = BIO_new(pBVar5);
    iVar1 = i2d_X509_REQ_bio(pBVar4,(X509_REQ *)request);
    if (iVar1 < 1) {
      pcVar6 = "%s: error writing certificate request in bio\n";
      goto LAB_0010b4b9;
    }
    if (d_flag != 0) {
      printf("%s: inner PKCS#7 in mem BIO \n",pname);
    }
    break;
  case 0x14:
    s->request_type_str = "20";
    pXVar8 = (X509 *)s->signercert;
    local_58 = (EVP_PKEY *)s->signerkey;
    if (d_flag != 0) {
      printf("%s: creating inner PKCS#7\n",pname);
    }
    pBVar5 = BIO_s_mem();
    pBVar4 = BIO_new(pBVar5);
    iVar1 = i2d_PKCS7_ISSUER_AND_SUBJECT_bio((BIO *)pBVar4,s->ias_getcertinit);
    if (iVar1 == 0) {
      pcVar6 = "%s: error writing GetCertInitial data in bio\n";
      goto LAB_0010b4b9;
    }
    break;
  case 0x15:
    s->request_type_str = "21";
    pXVar8 = (X509 *)localcert;
    local_58 = (EVP_PKEY *)rsa;
    pBVar5 = BIO_s_mem();
    pBVar4 = BIO_new(pBVar5);
    iVar1 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)pBVar4,s->ias_getcert);
    if (iVar1 == 0) {
      pcVar6 = "%s: error writing GetCert data in bio\n";
      goto LAB_0010b4b9;
    }
    break;
  case 0x16:
    s->request_type_str = "22";
    pXVar8 = (X509 *)localcert;
    local_58 = (EVP_PKEY *)rsa;
    pBVar5 = BIO_s_mem();
    pBVar4 = BIO_new(pBVar5);
    iVar1 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)pBVar4,s->ias_getcrl);
    if (iVar1 == 0) {
      pcVar6 = "%s: error writing GetCRL data in bio\n";
      goto LAB_0010b4b9;
    }
    break;
  default:
    pBVar4 = (BIO *)0x0;
    pXVar8 = (X509 *)0x0;
    local_58 = (EVP_PKEY *)0x0;
  }
  local_38 = pXVar8;
  lVar3 = BIO_ctrl(pBVar4,0xb,0,(void *)0x0);
  if ((int)lVar3 < 1) {
    fprintf(_stderr,"%s: error flushing databio\n",pname);
  }
  BIO_set_flags(pBVar4,0x200);
  parg = &s->request_payload;
  local_40 = pBVar4;
  lVar3 = BIO_ctrl(pBVar4,3,0,parg);
  s->request_len = (int)lVar3;
  if (v_flag != 0) {
    printf("%s: request data dump \n",pname);
    PEM_write_X509_REQ(_stdout,(X509_REQ *)request);
    if (v_flag != 0) {
      printf("%s: data payload size: %d bytes\n",pname,(ulong)(uint)s->request_len);
    }
  }
  certs = (stack_st_X509 *)OPENSSL_sk_new(0);
  if (certs == (stack_st_X509 *)0x0) {
    pcVar6 = "%s: error creating certificate stack\n";
  }
  else {
    pXVar7 = encert;
    if (encert == (X509 *)0x0) {
      pXVar7 = cacert;
    }
    iVar1 = OPENSSL_sk_push(certs,pXVar7);
    if (iVar1 < 1) {
      pcVar6 = "%s: error adding recipient encryption certificate\n";
    }
    else {
      if (d_flag != 0) {
        printf("\n %s: hexdump request payload\n",pname);
        for (uVar9 = 0; (long)uVar9 < (long)s->request_len; uVar9 = uVar9 + 1) {
          printf("%02x",(ulong)(uint)(int)(*parg)[uVar9]);
        }
        printf("\n %s: hexdump payload %d \n",pname,uVar9 & 0xffffffff);
      }
      pBVar4 = BIO_new_mem_buf(s->request_payload,s->request_len);
      if (pBVar4 == (BIO *)0x0) {
        pcVar6 = "%s: error creating data bio\n";
      }
      else {
        p7 = PKCS7_encrypt(certs,pBVar4,(EVP_CIPHER *)enc_alg,0x80);
        if (p7 == (PKCS7 *)0x0) {
          pcVar6 = "%s: request payload encrypt failed\n";
        }
        else {
          if (v_flag != 0) {
            printf("%s: successfully encrypted payload\n",pname);
          }
          pBVar5 = BIO_s_mem();
          pBVar4 = BIO_new(pBVar5);
          iVar1 = i2d_PKCS7_bio(pBVar4,p7);
          if (iVar1 < 1) {
            pcVar6 = "%s: error writing encrypted data\n";
          }
          else {
            BIO_ctrl(pBVar4,0xb,0,(void *)0x0);
            BIO_set_flags(pBVar4,0x200);
            uVar9 = BIO_ctrl(pBVar4,3,0,&buffer);
            if (v_flag != 0) {
              printf("%s: envelope size: %d bytes\n",pname,uVar9 & 0xffffffff);
            }
            if (d_flag != 0) {
              printf("%s: printing PEM fomatted PKCS#7\n",pname);
              PEM_write_PKCS7(_stdout,p7);
            }
            BIO_free(pBVar4);
            if (v_flag != 0) {
              printf("%s: creating outer PKCS#7\n",pname);
            }
            p7_00 = (PKCS7 *)PKCS7_new();
            s->request_p7 = p7_00;
            if (p7_00 == (PKCS7 *)0x0) {
              pcVar6 = "%s: failed creating PKCS#7 for signing\n";
            }
            else {
              iVar1 = PKCS7_set_type((PKCS7 *)p7_00,0x16);
              pXVar8 = local_38;
              if (iVar1 == 0) {
                pcVar6 = "%s: failed setting PKCS#7 type\n";
              }
              else {
                PKCS7_add_certificate((PKCS7 *)s->request_p7,local_38);
                p7si = PKCS7_add_signature((PKCS7 *)s->request_p7,pXVar8,local_58,(EVP_MD *)sig_alg)
                ;
                if (p7si == (PKCS7_SIGNER_INFO *)0x0) {
                  pcVar6 = "%s: error adding PKCS#7 signature\n";
                }
                else {
                  if ((d_flag != 0) &&
                     (printf("%s: signature added successfully\n",pname), d_flag != 0)) {
                    printf("%s: adding signed attributes\n",pname);
                  }
                  attrs = (stack_st_X509_ATTRIBUTE *)OPENSSL_sk_new_null();
                  add_attribute_string(attrs,nid_transId,s->transaction_id);
                  add_attribute_string(attrs,nid_messageType,s->request_type_str);
                  add_attribute_octet(attrs,nid_senderNonce,s->sender_nonce,s->sender_nonce_len);
                  PKCS7_set_signed_attributes(p7si,(stack_st_X509_ATTRIBUTE *)attrs);
                  data = OBJ_nid2obj(0x15);
                  iVar1 = PKCS7_add_signed_attribute(p7si,0x32,6,data);
                  if (iVar1 == 0) {
                    pcVar6 = "%s: error adding NID_pkcs9_contentType\n";
                  }
                  else {
                    iVar1 = PKCS7_content_new((PKCS7 *)s->request_p7,0x15);
                    if (iVar1 == 0) {
                      pcVar6 = "%s: failed setting PKCS#7 content type\n";
                    }
                    else {
                      pBVar4 = PKCS7_dataInit((PKCS7 *)s->request_p7,(BIO *)0x0);
                      if (pBVar4 == (BIO *)0x0) {
                        pcVar6 = "%s: error opening bio for writing PKCS#7 data\n";
                      }
                      else {
                        iVar1 = BIO_write(pBVar4,buffer,(int)uVar9);
                        if (iVar1 == (int)uVar9) {
                          if (v_flag != 0) {
                            printf("%s: PKCS#7 data written successfully\n",pname);
                          }
                          iVar1 = PKCS7_dataFinal((PKCS7 *)s->request_p7,pBVar4);
                          if (iVar1 != 0) {
                            if (d_flag != 0) {
                              printf("%s: printing PEM fomatted PKCS#7\n",pname);
                              PEM_write_PKCS7(_stdout,(PKCS7 *)s->request_p7);
                            }
                            if ((enc_base64 != 0) && (v_flag != 0)) {
                              printf("%s: applying base64 encoding\n",pname);
                            }
                            pBVar5 = BIO_s_mem();
                            append = BIO_new(pBVar5);
                            pBVar5 = BIO_f_base64();
                            b = BIO_new(pBVar5);
                            pBVar4 = append;
                            if (enc_base64 != 0) {
                              pBVar4 = BIO_push(b,append);
                            }
                            i2d_PKCS7_bio(pBVar4,(PKCS7 *)s->request_p7);
                            BIO_ctrl(pBVar4,0xb,0,(void *)0x0);
                            BIO_set_flags(append,0x200);
                            uVar9 = BIO_ctrl(append,3,0,parg);
                            s->request_len = (int)uVar9;
                            if (v_flag != 0) {
                              pcVar6 = "";
                              if (enc_base64 != 0) {
                                pcVar6 = "base64 encoded ";
                              }
                              printf("%s: %spayload size: %d bytes\n",pname,pcVar6,
                                     uVar9 & 0xffffffff);
                            }
                            BIO_free(pBVar4);
                            BIO_free(local_40);
                            return 0;
                          }
                          pcVar6 = "%s: error finalizing outer PKCS#7\n";
                        }
                        else {
                          pcVar6 = "%s: error writing PKCS#7 data\n";
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010b4b9:
  fprintf(_stderr,pcVar6,pname);
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int pkcs7_wrap(struct scep *s, int enc_base64) {
	BIO			*databio = NULL;
	BIO			*encbio = NULL;
	BIO			*pkcs7bio = NULL;
	BIO			*memorybio = NULL;
	BIO			*outbio = NULL;
	BIO			*base64bio = NULL;
	unsigned char		*buffer = NULL;
	int			rc, len = 0;
	int i=0;
	STACK_OF(X509)		*recipients;
	PKCS7			*p7enc;
	PKCS7_SIGNER_INFO	*si;
	STACK_OF(X509_ATTRIBUTE) *attributes;
	X509			*signercert = NULL;
	EVP_PKEY		*signerkey = NULL;

	/* Create a new sender nonce for all messages
	 * XXXXXXXXXXXXXX should it be per transaction? */
	s->sender_nonce_len = 16;
	s->sender_nonce = generate_nonce(s->sender_nonce_len);

	/* Prepare data payload */
	switch(s->request_type) {
		case SCEP_REQUEST_PKCSREQ:
			/*
			 * Set printable message type
			 * We set this later as an autheticated attribute
			 * "messageType".
			 */
			s->request_type_str = SCEP_REQUEST_PKCSREQ_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read request in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_X509_REQ_bio(databio, request)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"certificate request in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}else{
				if (d_flag)
					printf("%s: inner PKCS#7 in mem BIO \n", pname);

			}
			break;

		case SCEP_REQUEST_GETCERTINIT:

			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERTINIT_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SUBJECT_bio(databio,
						s->ias_getcertinit)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCertInitial data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCERT:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERT_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcert)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCert data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCRL:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCRL_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcrl)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCRL data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}

			break;
	}


	if( BIO_flush(databio) <= 0 ){
		fprintf(stderr, "%s: error flushing databio\n", pname);
	}
	BIO_set_flags(databio, BIO_FLAGS_MEM_RDONLY);

	/* Below this is the common code for all request_type */

	/* Read in the payload */
	s->request_len = BIO_get_mem_data(databio, &s->request_payload);
	if (v_flag){
		printf("%s: request data dump \n", pname);
		PEM_write_X509_REQ(stdout, request);
	}

	if (v_flag)
		printf("%s: data payload size: %d bytes\n", pname,
				s->request_len);


	/* Create encryption certificate stack */
	if ((recipients = sk_X509_new(NULL)) == NULL) {
		fprintf(stderr, "%s: error creating "
					"certificate stack\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	/*
	 * Use different CA cert for encryption if requested.
	 * encert will be non-NULL if the -e option was specified on the command
	 * line, or if the certificates were auto-selected.
	 */
	if (encert != NULL) {
		if (sk_X509_push(recipients, encert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	/* Use same CA cert also for encryption */
	} else {
		if (sk_X509_push(recipients, cacert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	}

	/* Create BIO for encryption  */
	if (d_flag){
		printf("\n %s: hexdump request payload\n", pname);
		for(i=0; i < s->request_len; i++ ){
			printf("%02x", s->request_payload[i]);
		}
		printf("\n %s: hexdump payload %d \n", pname , i);

	}


	if ((encbio = BIO_new_mem_buf(s->request_payload,
				s->request_len)) == NULL) {
		fprintf(stderr, "%s: error creating data " "bio\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Encrypt */
	if (!(p7enc = PKCS7_encrypt(recipients, encbio,
					enc_alg, PKCS7_BINARY))) {
		fprintf(stderr, "%s: request payload encrypt failed\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: successfully encrypted payload\n", pname);

	/* Write encrypted data */
	memorybio = BIO_new(BIO_s_mem());
	if (i2d_PKCS7_bio(memorybio, p7enc) <= 0) {
		fprintf(stderr, "%s: error writing encrypted data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	BIO_flush(memorybio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	len = BIO_get_mem_data(memorybio, &buffer);
	if (v_flag)
		printf("%s: envelope size: %d bytes\n", pname, len);
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, p7enc);
	}
	BIO_free(memorybio);

	/* Create outer PKCS#7  */
	if (v_flag)
		printf("%s: creating outer PKCS#7\n", pname);
	s->request_p7 = PKCS7_new();
	if (s->request_p7 == NULL) {
		fprintf(stderr, "%s: failed creating PKCS#7 for signing\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (!PKCS7_set_type(s->request_p7, NID_pkcs7_signed)) {
		fprintf(stderr, "%s: failed setting PKCS#7 type\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Add signer certificate  and signature */
	PKCS7_add_certificate(s->request_p7, signercert);
	if ((si = PKCS7_add_signature(s->request_p7,
				signercert, signerkey, sig_alg)) == NULL) {
		fprintf(stderr, "%s: error adding PKCS#7 signature\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag)
		printf("%s: signature added successfully\n", pname);

	/* Set signed attributes */
	if (d_flag)
		printf("%s: adding signed attributes\n", pname);
	attributes = sk_X509_ATTRIBUTE_new_null();
	add_attribute_string(attributes, nid_transId, s->transaction_id);
	add_attribute_string(attributes, nid_messageType, s->request_type_str);
	add_attribute_octet(attributes, nid_senderNonce, s->sender_nonce,
			s->sender_nonce_len);
	PKCS7_set_signed_attributes(si, attributes);
	/* Add contentType */
	if (!PKCS7_add_signed_attribute(si, NID_pkcs9_contentType,
			V_ASN1_OBJECT, OBJ_nid2obj(NID_pkcs7_data))) {
		fprintf(stderr, "%s: error adding NID_pkcs9_contentType\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Create new content */
	if (!PKCS7_content_new(s->request_p7, NID_pkcs7_data)) {
		fprintf(stderr, "%s: failed setting PKCS#7 content type\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Write data  */
	pkcs7bio = PKCS7_dataInit(s->request_p7, NULL);
	if (pkcs7bio == NULL) {
		fprintf(stderr, "%s: error opening bio for writing PKCS#7 "
			"data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (len != BIO_write(pkcs7bio, buffer, len)) {
		fprintf(stderr, "%s: error writing PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: PKCS#7 data written successfully\n", pname);

	/* Finalize PKCS#7  */
	if (!PKCS7_dataFinal(s->request_p7, pkcs7bio)) {
		fprintf(stderr, "%s: error finalizing outer PKCS#7\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, s->request_p7);
	}

	/* base64-encode the data */
	if (v_flag && enc_base64)
		printf("%s: applying base64 encoding\n",pname);

	/* Create base64 filtering bio */
	memorybio = BIO_new(BIO_s_mem());
	base64bio = BIO_new(BIO_f_base64());
	if (enc_base64)
		outbio = BIO_push(base64bio, memorybio);
	else
		outbio = memorybio;

	/* Copy PKCS#7 */
	i2d_PKCS7_bio(outbio, s->request_p7);
	BIO_flush(outbio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	s->request_len = BIO_get_mem_data(memorybio, &s->request_payload);
	if (v_flag)
		printf("%s: %spayload size: %d bytes\n",
				pname,
				enc_base64 ? "base64 encoded " : "",
				s->request_len);
	BIO_free(outbio);
	BIO_free(databio);
	return (0);
}